

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoBodies::MultiplyTandAdd
          (ChConstraintTwoBodies *this,ChVectorDynamic<double> *result,double l)

{
  ChVariables *pCVar1;
  long lVar2;
  double *pdVar3;
  Index index;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  pCVar1 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar1->disabled == false) {
    lVar2 = (long)pCVar1->offset;
    if ((lVar2 < 0) ||
       ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
        -6 < lVar2)) goto LAB_007d7b69;
    pdVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + lVar2;
    uVar4 = 6;
    if (((ulong)pdVar3 & 7) == 0) {
      uVar5 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar5 < 6) {
        uVar4 = (ulong)uVar5;
      }
      if (uVar5 != 0) goto LAB_007d7aa9;
    }
    else {
LAB_007d7aa9:
      uVar6 = 0;
      do {
        pdVar3[uVar6] =
             l * (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[uVar6] + pdVar3[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    if (uVar4 < 6) {
      do {
        pdVar3[uVar4] =
             l * (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[uVar4] + pdVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 != 6);
    }
  }
  pCVar1 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar1->disabled != false) {
    return;
  }
  lVar2 = (long)pCVar1->offset;
  if ((lVar2 < 0) ||
     ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
      < lVar2)) {
LAB_007d7b69:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           + lVar2;
  uVar4 = 6;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 6) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 == 0) goto LAB_007d7b45;
  }
  uVar6 = 0;
  do {
    pdVar3[uVar6] =
         l * (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
             m_data.array[uVar6] + pdVar3[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar4 != uVar6);
LAB_007d7b45:
  if (uVar4 < 6) {
    do {
      pdVar3[uVar4] =
           l * (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
               m_data.array[uVar4] + pdVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 6);
  }
  return;
}

Assistant:

void ChConstraintTwoBodies::MultiplyTandAdd(ChVectorDynamic<double>& result, double l) {
    if (variables_a->IsActive()) {
        result.segment(variables_a->GetOffset(), 6) += Cq_a.transpose() * l;
    }

    if (variables_b->IsActive()) {
        result.segment(variables_b->GetOffset(), 6) += Cq_b.transpose() * l;
    }
}